

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsCreateURIError(JsValueRef message,JsValueRef *error)

{
  anon_class_16_2_1b71c50a fn;
  JsErrorCode JVar1;
  JsValueRef *local_18;
  JsValueRef *error_local;
  JsValueRef message_local;
  
  fn.error = &local_18;
  fn.message = &error_local;
  local_18 = error;
  error_local = (JsValueRef *)message;
  JVar1 = ContextAPIWrapper<false,JsCreateURIError::__0>(fn);
  return JVar1;
}

Assistant:

CHAKRA_API JsCreateURIError(_In_ JsValueRef message, _Out_ JsValueRef *error)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&] (Js::ScriptContext * scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTCreateURIError, message);

        VALIDATE_INCOMING_REFERENCE(message, scriptContext);
        PARAM_NOT_NULL(error);
        *error = nullptr;

        Js::JavascriptError *newError = scriptContext->GetLibrary()->CreateURIError();
        SetErrorMessage(scriptContext, newError, message);
        *error = newError;

        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, error);

        return JsNoError;
    });
}